

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>
          (HeapInfo *this,size_t objectSize)

{
  BOOLEAN BVar1;
  uint i;
  
  if (this->isPageHeapEnabled == true) {
    i = GetMediumBucketIndex(objectSize);
    BVar1 = BVStatic<29UL>::Test(&this->mediumBlockPageHeapBucketFilter,i);
    return BVar1 != '\0';
  }
  return false;
}

Assistant:

bool HeapInfo::IsPageHeapEnabledForBlock(const size_t objectSize)
{
    if (IsPageHeapEnabled())
    {
        if (TBlockAttributes::IsSmallBlock)
        {
            return smallBlockPageHeapBucketFilter.Test(GetBucketIndex(objectSize)) != 0;
        }
        else if (TBlockAttributes::IsMediumBlock)
        {
            return mediumBlockPageHeapBucketFilter.Test(GetMediumBucketIndex(objectSize)) != 0;
        }
        else
        {
            return ((byte)this->pageHeapBlockType & (byte)PageHeapBlockTypeFilter::PageHeapBlockTypeFilterLarge) != 0;
        }
    }
    return false;
}